

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_has_encrypted_entries(archive *_a)

{
  size_t sVar1;
  code *UNRECOVERED_JUMPTABLE;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -2;
  if (((_a != (archive *)0x0) && (sVar1 = _a[0xf].error_string.length, sVar1 != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(sVar1 + 0x48), UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    uVar3 = (*UNRECOVERED_JUMPTABLE)(_a);
    if ((uVar3 & 3) != 0) {
      sVar1 = _a[0xf].error_string.length;
      iVar2 = -1;
      if ((sVar1 != 0) &&
         (UNRECOVERED_JUMPTABLE = *(code **)(sVar1 + 0x50), UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        iVar2 = (*UNRECOVERED_JUMPTABLE)(_a);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_has_encrypted_entries(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int format_supports_encryption = archive_read_format_capabilities(_a)
			& (ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_DATA | ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_METADATA);

	if (!_a || !format_supports_encryption) {
		/* Format in general doesn't support encryption */
		return ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED;
	}

	/* A reader potentially has read enough data now. */
	if (a->format && a->format->has_encrypted_entries) {
		return (a->format->has_encrypted_entries)(a);
	}

	/* For any other reason we cannot say how many entries are there. */
	return ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;
}